

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_init(uchar **chunk,ucvector *out,size_t length,char *type)

{
  int iVar1;
  uint uVar2;
  size_t local_38;
  size_t new_length;
  char *type_local;
  size_t length_local;
  ucvector *out_local;
  uchar **chunk_local;
  
  local_38 = out->size;
  new_length = (size_t)type;
  type_local = (char *)length;
  length_local = (size_t)out;
  out_local = (ucvector *)chunk;
  iVar1 = lodepng_addofl(local_38,length,&local_38);
  if (iVar1 == 0) {
    iVar1 = lodepng_addofl(local_38,0xc,&local_38);
    if (iVar1 == 0) {
      uVar2 = ucvector_resize((ucvector *)length_local,local_38);
      if (uVar2 == 0) {
        chunk_local._4_4_ = 0x53;
      }
      else {
        out_local->data = (uchar *)(((*(long *)length_local + local_38) - (long)type_local) + -0xc);
        lodepng_set32bitInt(out_local->data,(uint)type_local);
        lodepng_memcpy(out_local->data + 4,(void *)new_length,4);
        chunk_local._4_4_ = 0;
      }
    }
    else {
      chunk_local._4_4_ = 0x4d;
    }
  }
  else {
    chunk_local._4_4_ = 0x4d;
  }
  return chunk_local._4_4_;
}

Assistant:

static unsigned lodepng_chunk_init(unsigned char** chunk,
                                   ucvector* out,
                                   size_t length, const char* type) {
  size_t new_length = out->size;
  if(lodepng_addofl(new_length, length, &new_length)) return 77;
  if(lodepng_addofl(new_length, 12, &new_length)) return 77;
  if(!ucvector_resize(out, new_length)) return 83; /*alloc fail*/
  *chunk = out->data + new_length - length - 12u;

  /*1: length*/
  lodepng_set32bitInt(*chunk, (unsigned)length);

  /*2: chunk name (4 letters)*/
  lodepng_memcpy(*chunk + 4, type, 4);

  return 0;
}